

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void revive_mon(void *arg,long timeout)

{
  boolean bVar1;
  
  bVar1 = revive_corpse((obj *)arg);
  if (bVar1 != '\0') {
    return;
  }
  if (*(int *)((long)arg + 0x50) - 0x144U < 3) {
    pline("You feel less hassled.");
  }
  start_timer(*(level **)((long)arg + 0x20),0xfa - (ulong)(moves - *(int *)((long)arg + 0x5c)),2,1,
              arg);
  return;
}

Assistant:

void revive_mon(void *arg, long timeout)
{
    struct obj *body = (struct obj *) arg;

    /* if we succeed, the corpse is gone, otherwise, rot it away */
    if (!revive_corpse(body)) {
	if (is_rider(&mons[body->corpsenm]))
	    pline("You feel less hassled.");
	start_timer(body->olev, 250L - (moves-body->age),
					TIMER_OBJECT, ROT_CORPSE, arg);
    }
}